

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::tls1_get_shared_group(SSL_HANDSHAKE *hs,uint16_t *out_group_id)

{
  uint16_t uVar1;
  SSL *ssl;
  uint16_t *puVar2;
  size_t sVar3;
  uint16_t uVar4;
  size_t sVar5;
  size_t sVar6;
  uint16_t *puVar7;
  long lVar8;
  iterator __begin1;
  uint16_t *puVar9;
  bool bVar10;
  
  ssl = hs->ssl;
  if ((ssl->field_0xa4 & 1) == 0) {
    __assert_fail("ssl->server",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0xd9,"bool bssl::tls1_get_shared_group(SSL_HANDSHAKE *, uint16_t *)");
  }
  sVar6 = (hs->config->supported_group_list).size_;
  if (sVar6 == 0) {
    puVar9 = &kDefaultGroups;
    sVar6 = 3;
  }
  else {
    puVar9 = (hs->config->supported_group_list).data_;
  }
  bVar10 = (ssl->options >> 0x16 & 1) == 0;
  puVar2 = (hs->peer_supported_group_list).data_;
  puVar7 = puVar2;
  if (bVar10) {
    puVar7 = puVar9;
  }
  sVar5 = (hs->peer_supported_group_list).size_;
  sVar3 = sVar6;
  if (bVar10) {
    puVar9 = puVar2;
    sVar3 = sVar5;
  }
  bVar10 = sVar3 != 0;
  if (bVar10) {
    puVar2 = puVar9 + sVar3;
    if ((ssl->options >> 0x16 & 1) == 0) {
      sVar5 = sVar6;
    }
    do {
      if (sVar5 != 0) {
        uVar1 = *puVar9;
        lVar8 = 0;
        do {
          if ((uVar1 == *(uint16_t *)((long)puVar7 + lVar8)) &&
             ((uVar4 = ssl_protocol_version(ssl), 0x303 < uVar4 ||
              ((uVar1 != 0x11ec && (uVar1 != 0x6399)))))) {
            *out_group_id = uVar1;
            return bVar10;
          }
          lVar8 = lVar8 + 2;
        } while (sVar5 * 2 != lVar8);
      }
      puVar9 = puVar9 + 1;
      bVar10 = puVar9 != puVar2;
    } while (bVar10);
  }
  return bVar10;
}

Assistant:

bool tls1_get_shared_group(SSL_HANDSHAKE *hs, uint16_t *out_group_id) {
  SSL *const ssl = hs->ssl;
  assert(ssl->server);

  // Clients are not required to send a supported_groups extension. In this
  // case, the server is free to pick any group it likes. See RFC 4492,
  // section 4, paragraph 3.
  //
  // However, in the interests of compatibility, we will skip ECDH if the
  // client didn't send an extension because we can't be sure that they'll
  // support our favoured group. Thus we do not special-case an emtpy
  // |peer_supported_group_list|.

  Span<const uint16_t> groups = tls1_get_grouplist(hs);
  Span<const uint16_t> pref, supp;
  if (ssl->options & SSL_OP_CIPHER_SERVER_PREFERENCE) {
    pref = groups;
    supp = hs->peer_supported_group_list;
  } else {
    pref = hs->peer_supported_group_list;
    supp = groups;
  }

  for (uint16_t pref_group : pref) {
    for (uint16_t supp_group : supp) {
      if (pref_group == supp_group &&
          // Post-quantum key agreements don't fit in the u8-length-prefixed
          // ECPoint field in TLS 1.2 and below.
          (ssl_protocol_version(ssl) >= TLS1_3_VERSION ||
           !is_post_quantum_group(pref_group))) {
        *out_group_id = pref_group;
        return true;
      }
    }
  }

  return false;
}